

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O1

bool __thiscall CTxMemPool::HasNoInputsOf(CTxMemPool *this,CTransaction *tx)

{
  uchar *puVar1;
  pointer pCVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  bool bVar7;
  GenTxid local_59;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar7 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
          super__Vector_impl_data._M_finish == pCVar2;
  if (!bVar7) {
    local_59.m_is_wtxid = false;
    local_59.m_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
         *(undefined8 *)(pCVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems;
    local_59.m_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         *(undefined8 *)((pCVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8)
    ;
    local_59.m_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
         *(undefined8 *)
          ((pCVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
    local_59.m_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)
          ((pCVar2->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
    bVar3 = exists(this,&local_59);
    if (!bVar3) {
      uVar4 = 1;
      do {
        uVar6 = (ulong)uVar4;
        pCVar2 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar5 = ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pCVar2 >> 3) * 0x4ec4ec4ec4ec4ec5;
        bVar3 = uVar5 - uVar6 == 0;
        bVar7 = uVar5 < uVar6 || bVar3;
        if (uVar5 < uVar6 || bVar3) break;
        local_59.m_is_wtxid = false;
        local_59.m_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
             *(undefined8 *)&pCVar2[uVar6].prevout.hash;
        local_59.m_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
             *(undefined8 *)((long)&pCVar2[uVar6].prevout.hash + 8);
        puVar1 = (uchar *)((long)&pCVar2[uVar6].prevout.hash + 0x10);
        local_59.m_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_59.m_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 8);
        bVar3 = exists(this,&local_59);
        uVar4 = uVar4 + 1;
      } while (!bVar3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool CTxMemPool::HasNoInputsOf(const CTransaction &tx) const
{
    for (unsigned int i = 0; i < tx.vin.size(); i++)
        if (exists(GenTxid::Txid(tx.vin[i].prevout.hash)))
            return false;
    return true;
}